

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O0

void __thiscall
dynamicgraph::SignalPtr<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::SignalPtr
          (SignalPtr<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,
          Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *ptr,string *name)

{
  string local_40;
  string *local_20;
  string *name_local;
  Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *ptr_local;
  SignalPtr<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this_local;
  
  local_20 = name;
  name_local = (string *)ptr;
  ptr_local = (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::Signal
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)&this->field_0x28,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this->_vptr_SignalPtr = (_func_int **)0x16d9d0;
  *(undefined8 *)&this->field_0x28 = 0x16dba0;
  this->signalPtr = (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)name_local;
  this->modeNoThrow = false;
  this->transmitAbstract = false;
  this->abstractTransmitter = (SignalBase<int> *)0x0;
  return;
}

Assistant:

SignalPtr(Signal<T, Time> *ptr, std::string name = "")
      : Signal<T, Time>(name),
        signalPtr(ptr),
        modeNoThrow(false),
        transmitAbstract(false),
        abstractTransmitter(NULL) {}